

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_verify(secp256k1_fe *a)

{
  long in_RDI;
  undefined6 in_stack_fffffffffffffff0;
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  if (-1 < *(int *)(in_RDI + 0x28)) {
    bVar2 = *(int *)(in_RDI + 0x28) < 0x21;
  }
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0xa6,"test condition failed: (a->magnitude >= 0) && (a->magnitude <= 32)");
    abort();
  }
  bVar1 = true;
  if (*(int *)(in_RDI + 0x2c) != 0) {
    bVar1 = *(int *)(in_RDI + 0x2c) == 1;
  }
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((*(int *)(in_RDI + 0x2c) != 0) && (1 < *(int *)(in_RDI + 0x28))) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
              ,0xaa,"test condition failed: a->magnitude <= 1");
      abort();
    }
    secp256k1_fe_impl_verify
              ((secp256k1_fe *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_fffffffffffffff0)));
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
          ,0xa8,"test condition failed: (a->normalized == 0) || (a->normalized == 1)");
  abort();
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    VERIFY_CHECK((a->magnitude >= 0) && (a->magnitude <= 32));
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) VERIFY_CHECK(a->magnitude <= 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}